

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangle.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChTriangle::GetBoundingBox
          (ChTriangle *this,ChVector<double> *cmin,ChVector<double> *cmax,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChVector<double> trp3;
  ChVector<double> trp2;
  ChVector<double> trp1;
  Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_90;
  Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_88;
  undefined8 uStack_80;
  ulong local_78;
  Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_68;
  undefined8 uStack_60;
  ulong local_58;
  undefined1 local_48 [16];
  ulong local_38;
  
  local_68.m_matrix = &rot->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_68,&this->p1);
  local_88.m_matrix = &rot->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_88,&this->p2);
  local_90.m_matrix = &rot->super_Matrix<double,_3,_3,_1,_3,_3>;
  chrono::operator*(&local_90,&this->p3);
  auVar1._8_8_ = uStack_60;
  auVar1._0_8_ = local_68.m_matrix;
  auVar3._8_8_ = uStack_80;
  auVar3._0_8_ = local_88.m_matrix;
  auVar2 = vminpd_avx(local_48,auVar1);
  auVar1 = vmaxpd_avx(local_48,auVar1);
  auVar2 = vminpd_avx(auVar2,auVar3);
  auVar1 = vmaxpd_avx(auVar1,auVar3);
  *(undefined1 (*) [16])cmin->m_data = auVar2;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_38;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_58;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_78;
  auVar2 = vminsd_avx(auVar4,auVar5);
  auVar2 = vminsd_avx(auVar2,auVar6);
  cmin->m_data[2] = auVar2._0_8_;
  *(undefined1 (*) [16])cmax->m_data = auVar1;
  auVar1 = vmaxsd_avx(auVar4,auVar5);
  auVar1 = vmaxsd_avx(auVar1,auVar6);
  cmax->m_data[2] = auVar1._0_8_;
  return;
}

Assistant:

void ChTriangle::GetBoundingBox(ChVector<>& cmin, ChVector<>& cmax, const ChMatrix33<>& rot) const {
    ChVector<> trp1 = rot.transpose() * p1;
    ChVector<> trp2 = rot.transpose() * p2;
    ChVector<> trp3 = rot.transpose() * p3;

    cmin.x() = ChMin(ChMin(trp1.x(), trp2.x()), trp3.x());
    cmin.y() = ChMin(ChMin(trp1.y(), trp2.y()), trp3.y());
    cmin.z() = ChMin(ChMin(trp1.z(), trp2.z()), trp3.z());
    cmax.x() = ChMax(ChMax(trp1.x(), trp2.x()), trp3.x());
    cmax.y() = ChMax(ChMax(trp1.y(), trp2.y()), trp3.y());
    cmax.z() = ChMax(ChMax(trp1.z(), trp2.z()), trp3.z());
}